

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

void __thiscall crnlib::mipmapped_texture::change_dxt1_to_dxt1a(mipmapped_texture *this)

{
  mip_level *pmVar1;
  pixel_format pVar2;
  component_flags cVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  vector<crnlib::mip_level_*> *pvVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this->m_format == PIXEL_FMT_DXT1) {
    this->m_format = PIXEL_FMT_DXT1A;
    cVar3 = pixel_format_helpers::get_component_flags(PIXEL_FMT_DXT1A);
    this->m_comp_flags = cVar3;
    uVar6 = (this->m_faces).m_size;
    if (uVar6 != 0) {
      pvVar4 = (this->m_faces).m_p;
      uVar8 = 0;
      pvVar5 = pvVar4;
      do {
        if (pvVar5[uVar8].m_size != 0) {
          uVar7 = 0;
          do {
            pmVar1 = pvVar5[uVar8].m_p[uVar7];
            if (pmVar1->m_pDXTImage != (dxt_image *)0x0) {
              pVar2 = this->m_format;
              pmVar1->m_comp_flags = this->m_comp_flags;
              pmVar1->m_format = pVar2;
              dxt_image::change_dxt1_to_dxt1a(pmVar1->m_pDXTImage);
              pvVar4 = (this->m_faces).m_p;
            }
            uVar7 = uVar7 + 1;
            pvVar5 = pvVar4;
          } while (uVar7 < pvVar4[uVar8].m_size);
          uVar6 = (this->m_faces).m_size;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar6);
    }
  }
  return;
}

Assistant:

void mipmapped_texture::change_dxt1_to_dxt1a() {
  if (m_format != PIXEL_FMT_DXT1)
    return;

  m_format = PIXEL_FMT_DXT1A;

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  for (uint f = 0; f < m_faces.size(); f++) {
    for (uint l = 0; l < m_faces[f].size(); l++) {
      if (m_faces[f][l]->get_dxt_image()) {
        m_faces[f][l]->set_format(m_format);
        m_faces[f][l]->set_comp_flags(m_comp_flags);

        m_faces[f][l]->get_dxt_image()->change_dxt1_to_dxt1a();
      }
    }
  }
}